

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,true>>
::internal_emplace<std::pair<long_const,long>>
          (btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,true>>
           *this,iterator iter,pair<const_long,_long> *args)

{
  bool bVar1;
  byte bVar2;
  btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  *pbVar3;
  int *piVar4;
  btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  *pbVar5;
  node_type *pnVar6;
  allocator_type *paVar7;
  node_type **ppnVar8;
  size_type i;
  iterator iVar9;
  int local_44 [3];
  pair<const_long,_long> *ppStack_38;
  int max_count;
  pair<const_long,_long> *args_local;
  btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  *this_local;
  iterator iter_local;
  
  this_local = (btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                *)iter.node;
  iter_local.node._0_4_ = iter.position;
  ppStack_38 = args;
  args_local = (pair<const_long,_long> *)this;
  bVar1 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
          ::leaf((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                  *)this_local);
  if (!bVar1) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
    ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                  *)&this_local);
    iter_local.node._0_4_ = (int)iter_local.node + 1;
  }
  bVar2 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
          ::max_count((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                       *)this_local);
  local_44[2] = (int)bVar2;
  bVar2 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
          ::count((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                   *)this_local);
  pbVar5 = this_local;
  if ((uint)bVar2 == local_44[2]) {
    if (local_44[2] < 0xf) {
      pbVar3 = (btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                *)btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                  ::root((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                          *)this);
      if (pbVar5 != pbVar3) {
        __assert_fail("iter.node == root()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xc27,
                      "iterator phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>, Args = <std::pair<const long, long>>]"
                     );
      }
      local_44[1] = 0xf;
      local_44[0] = local_44[2] << 1;
      piVar4 = std::min<int>(local_44 + 1,local_44);
      pbVar5 = (btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                *)btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                  ::new_leaf_root_node
                            ((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                              *)this,*piVar4);
      this_local = pbVar5;
      pnVar6 = btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
               ::root((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                       *)this);
      paVar7 = btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
               ::mutable_allocator((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                                    *)this);
      btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
      ::swap((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
              *)pbVar5,pnVar6,paVar7);
      pnVar6 = btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
               ::root((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                       *)this);
      btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
      ::delete_leaf_node((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                          *)this,pnVar6);
      pbVar5 = this_local;
      ppnVar8 = btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                ::mutable_root((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                                *)this);
      *ppnVar8 = (node_type *)pbVar5;
      *(btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
        **)(this + 0x10) = this_local;
    }
    else {
      btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
      ::rebalance_or_split
                ((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                  *)this,(iterator *)&this_local);
    }
  }
  pbVar5 = this_local;
  i = (size_type)(int)iter_local.node;
  paVar7 = btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
           ::mutable_allocator((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                                *)this);
  btree_node<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,true>>
  ::emplace_value<std::pair<long_const,long>>
            ((btree_node<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,true>>
              *)pbVar5,i,paVar7,ppStack_38);
  *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
  iVar9.position = (int)iter_local.node;
  iVar9.node = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                *)this_local;
  iVar9._12_4_ = 0;
  return iVar9;
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }